

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O3

void __thiscall
embree::avx::BVHNSubdivPatch1MBlurBuilderSAH<4>::countSubPatches
          (BVHNSubdivPatch1MBlurBuilderSAH<4> *this,size_t *numSubPatches,size_t *numSubPatchesMB,
          ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pstate
          )

{
  undefined8 uVar1;
  Scene *pSVar2;
  Geometry *pGVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  runtime_error *this_00;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  BBox1f *pBVar18;
  undefined1 auVar19 [16];
  BBox1f BVar20;
  BBox1f BVar21;
  BBox1f BVar22;
  BBox1f BVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  size_t taskCount;
  Iterator<embree::SubdivMesh,_true> iter;
  task_group_context context;
  anon_class_1_0_00000001 local_1c3;
  undefined1 local_1c2 [10];
  BBox1f *local_1b8;
  unsigned_long local_1b0;
  Iterator<embree::GridMesh,_false> local_1a8;
  anon_class_8_1_4d25ca37_conflict local_198;
  anon_class_8_1_898bcfc2_conflict10 local_190;
  anon_class_16_2_341d598e_conflict2 local_188;
  undefined1 local_178 [12];
  undefined2 uStack_16c;
  undefined2 uStack_16a;
  intrusive_list_node *local_158;
  intrusive_list_node *piStack_150;
  string_resource_index local_138;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  BBox1f local_98;
  BBox1f BStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  anon_class_48_6_afa08d2e_conflict2 local_60;
  
  pSVar2 = this->scene;
  local_1a8.all = false;
  sVar12 = (pSVar2->geometries).size_active;
  if (sVar12 == 0) {
    uVar15 = 0;
  }
  else {
    uVar15 = 0;
    sVar10 = 0;
    do {
      pGVar3 = (pSVar2->geometries).items[sVar10].ptr;
      if (((pGVar3 == (Geometry *)0x0) || (((uint)pGVar3->field_8 & 0x2000ff) != 0x200017)) ||
         (pGVar3->numTimeSteps == 1)) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)pGVar3->numPrimitives;
      }
      uVar15 = uVar15 + uVar7;
      sVar10 = sVar10 + 1;
    } while (sVar12 != sVar10);
  }
  (pstate->super_ParallelForForState).N = uVar15;
  local_1c2._2_8_ = numSubPatches;
  local_1b8 = (BBox1f *)numSubPatchesMB;
  local_1a8.scene = pSVar2;
  iVar5 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar7 = uVar15 + 0x3ff >> 10;
  if ((ulong)(long)iVar5 < uVar7) {
    uVar7 = (long)iVar5;
  }
  uVar16 = 0x40;
  if (uVar7 < 0x40) {
    uVar16 = uVar7;
  }
  uVar16 = uVar16 + (uVar16 == 0);
  (pstate->super_ParallelForForState).taskCount = uVar16;
  (pstate->super_ParallelForForState).i0[0] = 0;
  (pstate->super_ParallelForForState).j0[0] = 0;
  if (1 < uVar7) {
    uVar14 = 0;
    uVar7 = uVar15 / uVar16;
    uVar11 = 1;
    sVar12 = 0;
    do {
      pGVar3 = (pSVar2->geometries).items[sVar12].ptr;
      if (((pGVar3 == (Geometry *)0x0) || (((uint)pGVar3->field_8 & 0x2000ff) != 0x200017)) ||
         ((pGVar3->numTimeSteps == 1 || (uVar13 = (ulong)pGVar3->numPrimitives, uVar13 == 0)))) {
        uVar13 = 0;
        lVar9 = 0;
      }
      else {
        uVar8 = (uVar11 + 1) * uVar15;
        lVar9 = 0;
        uVar17 = 0;
        do {
          uVar6 = uVar7;
          uVar7 = uVar6;
          if ((uVar14 + uVar13 + lVar9 < uVar6) || (uVar16 <= uVar11)) break;
          (pstate->super_ParallelForForState).i0[uVar11] = sVar12;
          uVar17 = uVar17 + (uVar6 - uVar14);
          (pstate->super_ParallelForForState).j0[uVar11] = uVar17;
          uVar11 = uVar11 + 1;
          uVar16 = (pstate->super_ParallelForForState).taskCount;
          uVar7 = uVar8 / uVar16;
          lVar9 = -uVar17;
          uVar8 = uVar8 + uVar15;
          uVar14 = uVar6;
        } while (uVar17 < uVar13);
      }
      uVar14 = uVar13 + uVar14 + lVar9;
      sVar12 = sVar12 + 1;
    } while (uVar11 < uVar16);
  }
  local_60.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_f8;
  local_f8 = INFINITY;
  fStack_f4 = INFINITY;
  fStack_f0 = INFINITY;
  fStack_ec = INFINITY;
  local_e8 = -INFINITY;
  fStack_e4 = -INFINITY;
  fStack_e0 = -INFINITY;
  fStack_dc = -INFINITY;
  local_d8 = INFINITY;
  fStack_d4 = INFINITY;
  fStack_d0 = INFINITY;
  fStack_cc = INFINITY;
  local_c8 = -INFINITY;
  fStack_c4 = -INFINITY;
  fStack_c0 = -INFINITY;
  fStack_bc = -INFINITY;
  local_b8 = INFINITY;
  fStack_b4 = INFINITY;
  fStack_b0 = INFINITY;
  fStack_ac = INFINITY;
  local_a8 = -INFINITY;
  fStack_a4 = -INFINITY;
  fStack_a0 = -INFINITY;
  fStack_9c = -INFINITY;
  local_98.lower = 0.0;
  local_98.upper = 0.0;
  BStack_90.lower = 0.0;
  BStack_90.upper = 0.0;
  uStack_88 = 0;
  uStack_80 = 0;
  local_78 = 0.0;
  auVar19._8_4_ = 0x3f800000;
  auVar19._0_8_ = 0x3f8000003f800000;
  auVar19._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar19);
  fStack_74 = (float)uVar1;
  fStack_70 = (float)((ulong)uVar1 >> 0x20);
  fStack_6c = 0.0;
  local_198.array2 = &local_1a8;
  local_60.getSize = &local_198;
  local_188.func = (anon_class_8_1_89912a77 *)local_1c2;
  local_60.func = &local_188;
  local_60.taskCount = &local_1b0;
  local_60.reduction = &local_1c3;
  uStack_16c = 0x401;
  local_158 = (intrusive_list_node *)0x0;
  piStack_150 = (intrusive_list_node *)0x0;
  local_138 = CUSTOM_CTX;
  local_1b0 = uVar16;
  local_188.array2 = (Iterator<embree::GridMesh,_true> *)local_198.array2;
  local_60.state = pstate;
  tbb::detail::r1::initialize((task_group_context *)local_178);
  local_190.func = &local_60;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,uVar16,1,&local_190,(auto_partitioner *)(local_1c2 + 1),
             (task_group_context *)local_178);
  cVar4 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_178);
  if (cVar4 != '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"task cancelled");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy((task_group_context *)local_178);
  stack0xfffffffffffffe90 = (BBox1f)uStack_80;
  local_178._0_8_ = uStack_88;
  if (local_1b0 != 0) {
    BVar22.upper = fStack_74;
    BVar22.lower = local_78;
    BVar23.upper = fStack_6c;
    BVar23.lower = fStack_70;
    pBVar18 = &(pstate->prefix_state).sums[0].max_time_range;
    BVar20.lower = 0.0;
    BVar20.upper = 1.0;
    BVar21.lower = 1.0;
    BVar21.upper = 0.0;
    fVar27 = INFINITY;
    fVar24 = INFINITY;
    fVar25 = INFINITY;
    fVar26 = INFINITY;
    fVar31 = -INFINITY;
    fVar28 = -INFINITY;
    fVar29 = -INFINITY;
    fVar30 = -INFINITY;
    do {
      pBVar18[-0x10].lower = local_f8;
      pBVar18[-0x10].upper = fStack_f4;
      pBVar18[-0xf].lower = fStack_f0;
      pBVar18[-0xf].upper = fStack_ec;
      pBVar18[-0xe].lower = local_e8;
      pBVar18[-0xe].upper = fStack_e4;
      pBVar18[-0xd].lower = fStack_e0;
      pBVar18[-0xd].upper = fStack_dc;
      pBVar18[-0xc].lower = local_d8;
      pBVar18[-0xc].upper = fStack_d4;
      pBVar18[-0xb].lower = fStack_d0;
      pBVar18[-0xb].upper = fStack_cc;
      pBVar18[-10].lower = local_c8;
      pBVar18[-10].upper = fStack_c4;
      pBVar18[-9].lower = fStack_c0;
      pBVar18[-9].upper = fStack_bc;
      pBVar18[-8].lower = local_b8;
      pBVar18[-8].upper = fStack_b4;
      pBVar18[-7].lower = fStack_b0;
      pBVar18[-7].upper = fStack_ac;
      pBVar18[-6].lower = local_a8;
      pBVar18[-6].upper = fStack_a4;
      pBVar18[-5].lower = fStack_a0;
      pBVar18[-5].upper = fStack_9c;
      pBVar18[-4] = local_98;
      pBVar18[-3] = BStack_90;
      pBVar18[-2].lower = (float)local_178._0_4_;
      pBVar18[-2].upper = (float)local_178._4_4_;
      pBVar18[-1] = stack0xfffffffffffffe90;
      *pBVar18 = BVar22;
      pBVar18[1] = BVar23;
      local_98 = (BBox1f)((long)local_98 + (long)pBVar18[-0x484]);
      BStack_90 = (BBox1f)((long)BStack_90 + (long)pBVar18[-0x483]);
      pBVar18 = pBVar18 + 0x12;
      local_1b0 = local_1b0 - 1;
      local_b8 = fVar24;
      fStack_b4 = fVar25;
      fStack_b0 = fVar26;
      fStack_ac = fVar27;
      local_f8 = fVar24;
      fStack_f4 = fVar25;
      fStack_f0 = fVar26;
      fStack_ec = fVar27;
      local_d8 = fVar24;
      fStack_d4 = fVar25;
      fStack_d0 = fVar26;
      fStack_cc = fVar27;
      local_a8 = fVar28;
      fStack_a4 = fVar29;
      fStack_a0 = fVar30;
      fStack_9c = fVar31;
      local_e8 = fVar28;
      fStack_e4 = fVar29;
      fStack_e0 = fVar30;
      fStack_dc = fVar31;
      local_c8 = fVar28;
      fStack_c4 = fVar29;
      fStack_c0 = fVar30;
      fStack_bc = fVar31;
      BVar22 = BVar20;
      BVar23 = BVar21;
      _local_178 = ZEXT816(0) << 0x20;
    } while (local_1b0 != 0);
  }
  *(BBox1f *)local_1c2._2_8_ = local_98;
  *local_1b8 = BStack_90;
  return;
}

Assistant:

void countSubPatches(size_t& numSubPatches, size_t& numSubPatchesMB, ParallelForForPrefixSumState<PrimInfoMB>& pstate)
      {
        Scene::Iterator<SubdivMesh,true> iter(scene);
        pstate.init(iter,size_t(1024));

        PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfoMB
        { 
          size_t s = 0;
          size_t sMB = 0;
          for (size_t f=r.begin(); f!=r.end(); ++f) 
          {          
            if (!mesh->valid(f)) continue;
            size_t count = patch_eval_subdivision_count(mesh->getHalfEdge(0,f));
            s += count;
            sMB += count * mesh->numTimeSteps;
          }
          return PrimInfoMB(s,sMB);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB(a.begin()+b.begin(),a.end()+b.end()); });

        numSubPatches = pinfo.begin();
        numSubPatchesMB = pinfo.end();
      }